

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZParFrontStructMatrix.cpp
# Opt level: O1

TPZMatrix<std::complex<double>_> * __thiscall
TPZParFrontStructMatrix<TPZFrontNonSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
::CreateAssemble(TPZParFrontStructMatrix<TPZFrontNonSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
                 *this,TPZFMatrix<std::complex<double>_> *rhs,
                TPZAutoPointer<TPZGuiInterface> *guiInterface)

{
  int64_t globalsize;
  int iVar1;
  TPZParFrontMatrix<std::complex<double>,_TPZFileEqnStorage<std::complex<double>_>,_TPZFrontNonSym<std::complex<double>_>_>
  *this_00;
  undefined4 extraout_var;
  TPZAutoPointer<TPZGuiInterface> local_30;
  
  TPZStructMatrixOT<std::complex<double>_>::InitCreateAssemble
            ((TPZStructMatrixOT<std::complex<double>_> *)
             &(this->
              super_TPZFrontStructMatrix<TPZFrontNonSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
              ).super_TPZStructMatrixT<std::complex<double>_>.super_TPZStructMatrix.field_0xa0);
  globalsize = (&(this->
                 super_TPZFrontStructMatrix<TPZFrontNonSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
                 ).super_TPZStructMatrixT<std::complex<double>_>.super_TPZStructMatrix.
                 fEquationFilter.fNumEq)
               [(ulong)(this->
                       super_TPZFrontStructMatrix<TPZFrontNonSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
                       ).super_TPZStructMatrixT<std::complex<double>_>.super_TPZStructMatrix.
                       fEquationFilter.fIsActive * 4];
  this_00 = (TPZParFrontMatrix<std::complex<double>,_TPZFileEqnStorage<std::complex<double>_>,_TPZFrontNonSym<std::complex<double>_>_>
             *)operator_new(800);
  TPZParFrontMatrix<std::complex<double>,_TPZFileEqnStorage<std::complex<double>_>,_TPZFrontNonSym<std::complex<double>_>_>
  ::TPZParFrontMatrix(this_00,globalsize);
  if ((this->
      super_TPZFrontStructMatrix<TPZFrontNonSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
      ).fDecomposeType != ENoDecompose) {
    iVar1 = (*(this_00->
              super_TPZFrontMatrix<std::complex<double>,_TPZFileEqnStorage<std::complex<double>_>,_TPZFrontNonSym<std::complex<double>_>_>
              ).super_TPZAbstractFrontMatrix<std::complex<double>_>.
              super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x4f])(this_00);
    (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x50))
              ((long *)CONCAT44(extraout_var,iVar1),
               (this->
               super_TPZFrontStructMatrix<TPZFrontNonSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
               ).fDecomposeType);
  }
  (*(rhs->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
    _vptr_TPZSavable[0xe])(rhs,globalsize,1);
  local_30 = (TPZAutoPointer<TPZGuiInterface>)guiInterface->fRef;
  LOCK();
  ((local_30.fRef)->fCounter).super___atomic_base<int>._M_i =
       ((local_30.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  (**(code **)(*(long *)&(this->
                         super_TPZFrontStructMatrix<TPZFrontNonSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
                         ).super_TPZStructMatrixT<std::complex<double>_>.super_TPZStructMatrix +
              0x78))(this,this_00,rhs);
  TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer(&local_30);
  return (TPZMatrix<std::complex<double>_> *)this_00;
}

Assistant:

TPZMatrix<TVar> * TPZParFrontStructMatrix<TFront,TVar,TPar>::CreateAssemble(TPZFMatrix<TVar> &rhs,TPZAutoPointer<TPZGuiInterface> guiInterface)
{
    TPar::InitCreateAssemble();
	
	//TPZFrontMatrix<TPZStackEqnStorage, TFront> *mat = new TPZFrontMatrix<TPZStackEqnStorage, TFront>(fMesh->NEquations());
	
	//TPZFrontMatrix<TPZFileEqnStorage, TFront> *mat = new TPZFrontMatrix<TPZFileEqnStorage, TFront>(fMesh->NEquations());
	int64_t neq = this->fEquationFilter.NActiveEquations();
	
	//
#ifdef STACKSTORAGE
	TPZParFrontMatrix<TVar, TPZStackEqnStorage<TVar>, TFront> *mat = new TPZParFrontMatrix<TVar, TPZStackEqnStorage<TVar>, TFront>(neq);
#else
    TPZParFrontMatrix<TVar, TPZFileEqnStorage<TVar>, TFront> *mat = new TPZParFrontMatrix<TVar, TPZFileEqnStorage<TVar>, TFront>(neq);
#endif
    if (this->fDecomposeType != ENoDecompose)
    {
        mat->GetFront().SetDecomposeType(this->fDecomposeType);
    }
	rhs.Redim(neq,1);
	
	Assemble(*mat,rhs,guiInterface);
	return mat;
	
}